

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::OP_ScopedDeleteFld<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementScopedC<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  FunctionBody *this_00;
  
  this_00 = *(FunctionBody **)(this + 0x88);
  if ((~*(ushort *)&(this_00->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 & 0x1100)
      == 0) {
    GetLocalFrameDisplay(this);
    this_00 = *(FunctionBody **)(this + 0x88);
  }
  FunctionBody::GetReferencedPropertyId(this_00,(uint)playout->PropertyIdIndex);
  ValidateRegValue(this,*(Var *)(this + 0x168),false,true);
}

Assistant:

void InterpreterStackFrame::OP_ScopedDeleteFld(const unaligned OpLayoutT_ElementScopedC<T> * playout)
    {
        // Implicit root object as default instance
        Var result = JavascriptOperators::OP_DeletePropertyScoped(GetEnvForEvalCode(),
            m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex),
            GetReg(Js::FunctionBody::RootObjectRegSlot), GetScriptContext());
        SetReg(playout->Value, result);
    }